

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::SetOneofIndexBase
          (FieldGeneratorMap *this,int index_base)

{
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *this_00;
  FieldGenerator *this_01;
  int i;
  long i_00;
  
  for (i_00 = 0; i_00 < *(int *)(this->descriptor_ + 0x2c); i_00 = i_00 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
              ::operator[](&this->field_generators_,i_00);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::
              operator->(this_00);
    FieldGenerator::SetOneofIndexBase(this_01,index_base);
  }
  return;
}

Assistant:

void FieldGeneratorMap::SetOneofIndexBase(int index_base) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_[i]->SetOneofIndexBase(index_base);
  }
}